

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O0

void __thiscall
Customize::unserialize_impl<serialization::json_iarchive>(Customize *this,json_iarchive *ar)

{
  array<const_char_*,_2UL> *this_00;
  const_iterator local_28;
  int local_20;
  serialization_trace local_19;
  json_iarchive *pjStack_18;
  serialization_trace trace;
  json_iarchive *ar_local;
  Customize *this_local;
  
  local_20 = 0x34;
  pjStack_18 = ar;
  serialization::serialization_trace::serialization_trace<char_const(&)[17],char_const(&)[97],int>
            (&local_19,(char (*) [17])"unserialize_impl",
             (char (*) [97])
             "/workspace/llm4binary/github/license_c_cmakelists/avplayer[P]serialization2/examples/example.cpp"
             ,&local_20);
  this_00 = serialization_meta();
  local_28 = std::array<const_char_*,_2UL>::begin(this_00);
  serialization::
  unserialize_unpack<char_const*const*,serialization::json_iarchive,int&,std::__cxx11::string&>
            (&local_28,pjStack_18,&this->a,&this->b);
  return;
}

Assistant:

int main(int argc, char * argv[])
{
    try
    {
        AddressBook ab = {
            {
                {"aaaaaaa", 12},
                {"qwasasdq", 22331},
                {"12qweqweqweqwe", 123123}
            },
            "opt string",
            {
                {"a", {"a", 1} },
                {"b", {"b", 2} },
                {"c", {"c", 3} },
            },
            {
                { {1, 2, 3}, {4, 5, 6}, {7, 8, 9} },
                { {11, 12, 13}, {14, 15, 16} },
                { {21, 22, 23} },
            }
        };

        // json serialize
        serialization::json_oarchive json_oa;
        serialization::serialize(json_oa, ab);
        std::cout << "json serilize result: " << json_oa.data() << std::endl;

        // json unserialize
        AddressBook ab2;
        serialization::json_iarchive json_ia;
        json_ia.load_data(json_oa.data());
        serialization::unserialize(json_ia, ab2);
        std::cout << "json unserilize result: " << (ab == ab2 ? "success" : "fail") << std::endl;

        // xml serialize
        serialization::xml_oarchive xml_oa;
        serialization::serialize(xml_oa, ab);
        std::string xml_str = xml_oa.data();
        std::cout << "xml serilize result: " << xml_str << std::endl;

        // xml unserialize
        AddressBook ab3;
        serialization::xml_iarchive xml_ia;
        xml_ia.load_data(&xml_str[0]);
        serialization::unserialize(xml_ia, ab3);
        std::cout << "xml unserilize result: " << (ab == ab3 ? "success" : "fail") << std::endl;

        //test coustomize 
        Customize c{123, "456"}, c2;
        serialization::serialize(json_oa, c);
        std::cout << "customize json serilize result: " << json_oa.data() << std::endl;
        json_ia.load_data(json_oa.data());
        serialization::unserialize(json_ia, c2);
        std::cout << "customize json unserilize result: " << (c == c2 ? "success" : "fail") << std::endl;

    }
    catch (serialization::serialization_error & err)
    {
        std::cout << err.where() << ":" << err.what() << std::endl;
    }
}